

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  Entry **this_00;
  bool bVar1;
  string *target;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  cmMakefile *mf;
  cmLocalGenerator *pcVar2;
  cmCompiledGeneratorExpression *pcVar3;
  char *pcVar4;
  reference ppcVar5;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar6;
  _Self local_968;
  _Self local_960;
  const_iterator li;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *allTargets;
  string local_948;
  undefined1 local_921;
  undefined1 local_920 [8];
  cmGeneratorTarget gDummyHead;
  string local_3a8;
  undefined1 local_388 [8];
  cmTarget dummyHead;
  auto_ptr<cmCompiledGeneratorExpression> local_138;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmListFileBacktrace local_78;
  undefined1 local_58 [8];
  cmGeneratorExpression ge;
  char *prop;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *emitted_local;
  cmGeneratorTarget *tgt_local;
  string *propName_local;
  cmExportTryCompileFileGenerator *this_local;
  string *result;
  
  ge.Backtrace.Cur = (Entry *)cmGeneratorTarget::GetProperty(tgt,propName);
  if (ge.Backtrace.Cur == (Entry *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    cmListFileBacktrace::cmListFileBacktrace(&local_78);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_58,&local_78);
    cmListFileBacktrace::~cmListFileBacktrace(&local_78);
    target = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)&cge,target,propName,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&dummyHead.Backtrace.Cur,local_58);
    this_00 = &dummyHead.Backtrace.Cur;
    r = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)this_00);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_138,r);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3a8,"try_compile_dummy_exe",
               (allocator *)
               ((long)&gDummyHead.MaxLanguageStandards._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    mf = cmTarget::GetMakefile(tgt->Target);
    cmTarget::cmTarget((cmTarget *)local_388,&local_3a8,EXECUTABLE,VisibilityNormal,mf);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gDummyHead.MaxLanguageStandards._M_t._M_impl.super__Rb_tree_header.
                       _M_node_count + 7));
    pcVar2 = cmGeneratorTarget::GetLocalGenerator(tgt);
    cmGeneratorTarget::cmGeneratorTarget
              ((cmGeneratorTarget *)local_920,(cmTarget *)local_388,pcVar2);
    local_921 = 0;
    pcVar3 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_138);
    pcVar2 = cmGeneratorTarget::GetLocalGenerator(tgt);
    std::__cxx11::string::string((string *)&local_948);
    pcVar4 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar3,pcVar2,&this->Config,false,(cmGeneratorTarget *)local_920,tgt,
                        (cmGeneratorExpressionDAGChecker *)&cge,&local_948);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar4,(allocator *)((long)&allTargets + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&allTargets + 7));
    std::__cxx11::string::~string((string *)&local_948);
    pcVar3 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&local_138);
    li._M_node = (_Base_ptr)cmCompiledGeneratorExpression::GetAllTargetsSeen(pcVar3);
    local_960._M_node =
         (_Base_ptr)
         std::
         set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
         ::begin((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  *)li._M_node);
    while( true ) {
      local_968._M_node =
           (_Base_ptr)
           std::
           set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
           ::end(li._M_node);
      bVar1 = std::operator!=(&local_960,&local_968);
      if (!bVar1) break;
      ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&local_960);
      pVar6 = std::
              set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
              ::insert(emitted,ppcVar5);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        ppcVar5 = std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator*(&local_960);
        std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
        push_back(&this->Exports,ppcVar5);
      }
      std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>::operator++(&local_960);
    }
    local_921 = 1;
    cmGeneratorTarget::~cmGeneratorTarget((cmGeneratorTarget *)local_920);
    cmTarget::~cmTarget((cmTarget *)local_388);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_138);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)&cge);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
  const std::string& propName, cmGeneratorTarget const* tgt,
  std::set<cmGeneratorTarget const*>& emitted)
{
  const char* prop = tgt->GetProperty(propName);
  if (!prop) {
    return std::string();
  }

  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(tgt->GetName(), propName,
                                             CM_NULLPTR, CM_NULLPTR);

  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(prop);

  cmTarget dummyHead("try_compile_dummy_exe", cmStateEnums::EXECUTABLE,
                     cmTarget::VisibilityNormal, tgt->Target->GetMakefile());

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result = cge->Evaluate(tgt->GetLocalGenerator(), this->Config,
                                     false, &gDummyHead, tgt, &dagChecker);

  const std::set<cmGeneratorTarget const*>& allTargets =
    cge->GetAllTargetsSeen();
  for (std::set<cmGeneratorTarget const*>::const_iterator li =
         allTargets.begin();
       li != allTargets.end(); ++li) {
    if (emitted.insert(*li).second) {
      this->Exports.push_back(*li);
    }
  }
  return result;
}